

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_workgraph.cpp
# Opt level: O0

Id dxil_spv::emit_load_node_input_push_parameter(Impl *impl,NodeInputParameter param,Id type)

{
  Id IVar1;
  Builder *pBVar2;
  Operation *this;
  Operation *this_00;
  Operation *load_offset_point;
  Operation *access_offset_point;
  Id type_local;
  NodeInputParameter param_local;
  Impl *impl_local;
  
  pBVar2 = Converter::Impl::builder(impl);
  IVar1 = spv::Builder::makePointer(pBVar2,StorageClassPushConstant,type);
  this = Converter::Impl::allocate(impl,OpAccessChain,IVar1);
  Operation::add_id(this,(impl->node_input).node_dispatch_push_id);
  pBVar2 = Converter::Impl::builder(impl);
  IVar1 = spv::Builder::makeUintConstant(pBVar2,param,false);
  Operation::add_id(this,IVar1);
  Converter::Impl::add(impl,this,false);
  this_00 = Converter::Impl::allocate(impl,OpLoad,type);
  Operation::add_id(this_00,this->id);
  Converter::Impl::add(impl,this_00,false);
  return this_00->id;
}

Assistant:

spv::Id emit_load_node_input_push_parameter(
	Converter::Impl &impl, NodeInputParameter param, spv::Id type)
{
	auto *access_offset_point = impl.allocate(spv::OpAccessChain, impl.builder().makePointer(
		spv::StorageClassPushConstant, type));
	access_offset_point->add_id(impl.node_input.node_dispatch_push_id);
	access_offset_point->add_id(impl.builder().makeUintConstant(param));
	impl.add(access_offset_point);

	auto *load_offset_point = impl.allocate(spv::OpLoad, type);
	load_offset_point->add_id(access_offset_point->id);
	impl.add(load_offset_point);

	return load_offset_point->id;
}